

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

uint32 add_ctab_typeinfo(Context_conflict *ctx,MOJOSHADER_symbolTypeInfo *info)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  uint32 uVar2;
  uint8 *bytes_00;
  long lVar3;
  ulong len;
  ulong uVar4;
  undefined1 auVar5 [16];
  uint8 bytes [16];
  
  auVar5._0_4_ = info->parameter_class;
  auVar5._4_4_ = info->parameter_type;
  auVar5._8_4_ = info->rows;
  auVar5._12_4_ = info->columns;
  auVar5 = pshuflw(auVar5,auVar5,0xe8);
  auVar5 = pshufhw(auVar5,auVar5,0xe8);
  bytes._0_4_ = auVar5._0_4_;
  bytes._4_4_ = auVar5._8_4_;
  bytes._8_2_ = *(undefined2 *)&info->elements;
  bytes._10_2_ = (undefined2)info->member_count;
  len = (ulong)(info->member_count << 3);
  bytes_00 = (uint8 *)Malloc(ctx,len);
  if (bytes_00 == (uint8 *)0x0) {
    uVar2 = 0;
  }
  else {
    lVar3 = 8;
    for (uVar4 = 0; uVar4 < info->member_count; uVar4 = uVar4 + 1) {
      pMVar1 = info->members;
      uVar2 = add_ctab_string(ctx,*(char **)((long)pMVar1 + lVar3 + -8));
      *(uint32 *)(bytes_00 + uVar4 * 8) = uVar2;
      uVar2 = add_ctab_typeinfo(ctx,(MOJOSHADER_symbolTypeInfo *)((long)&pMVar1->name + lVar3));
      *(uint32 *)(bytes_00 + uVar4 * 8 + 4) = uVar2;
      lVar3 = lVar3 + 0x28;
    }
    uVar2 = add_ctab_bytes(ctx,bytes_00,len);
    (*ctx->free)(bytes_00,ctx->malloc_data);
  }
  bytes._12_4_ = uVar2;
  uVar2 = add_ctab_bytes(ctx,bytes,0x10);
  return uVar2;
}

Assistant:

static uint32 add_ctab_typeinfo(Context *ctx, const MOJOSHADER_symbolTypeInfo *info)
{
    uint8 bytes[CTYPEINFO_SIZE];
    union { uint8 *ui8; uint16 *ui16; uint32 *ui32; } ptr;
    ptr.ui8 = bytes;

    *(ptr.ui16++) = SWAP16((uint16) info->parameter_class);
    *(ptr.ui16++) = SWAP16((uint16) info->parameter_type);
    *(ptr.ui16++) = SWAP16((uint16) info->rows);
    *(ptr.ui16++) = SWAP16((uint16) info->columns);
    *(ptr.ui16++) = SWAP16((uint16) info->elements);
    *(ptr.ui16++) = SWAP16((uint16) info->member_count);
    *(ptr.ui32++) = SWAP32(add_ctab_members(ctx, info));

    return add_ctab_bytes(ctx, bytes, sizeof (bytes));
}